

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_choice(lysp_yin_ctx *ctx,tree_node_meta *node_meta)

{
  lysp_node *plVar1;
  lysp_node *parent;
  undefined8 in_stack_fffffffffffffd98;
  undefined4 uVar2;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  char **iter__;
  size_t offset__;
  char *p__;
  size_t subelems_size;
  lysp_node_choice *choice;
  yin_subelement *subelems;
  tree_node_meta *ptStack_48;
  LY_ERR ret;
  tree_node_meta *node_meta_local;
  lysp_yin_ctx *ctx_local;
  
  uVar2 = (undefined4)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  subelems._4_4_ = 0;
  choice = (lysp_node_choice *)0x0;
  ptStack_48 = node_meta;
  node_meta_local = (tree_node_meta *)ctx;
  parent = (lysp_node *)calloc(1,0x68);
  if (parent == (lysp_node *)0x0) {
    ly_log((ly_ctx *)*node_meta_local[4].nodes,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "yin_parse_choice");
    ctx_local._4_4_ = LY_EMEM;
  }
  else {
    if (*ptStack_48->nodes == (lysp_node *)0x0) {
      *ptStack_48->nodes = parent;
    }
    else {
      plVar1 = *ptStack_48->nodes;
      while (_ret___1 = (long *)((long)plVar1 +
                                (long)*ptStack_48->nodes + (0x10 - (long)*ptStack_48->nodes)),
            *_ret___1 != 0) {
        plVar1 = (lysp_node *)*_ret___1;
      }
      *_ret___1 = (long)parent;
    }
    parent->nodetype = 2;
    parent->parent = ptStack_48->parent;
    ctx_local._4_4_ = lyxml_ctx_next((lyxml_ctx *)node_meta_local[4].nodes);
    if (((ctx_local._4_4_ == LY_SUCCESS) &&
        (ctx_local._4_4_ =
              yin_parse_attribute((lysp_yin_ctx *)node_meta_local,YIN_ARG_NAME,&parent->name,
                                  Y_IDENTIF_ARG,LY_STMT_CHOICE), ctx_local._4_4_ == LY_SUCCESS)) &&
       (ctx_local._4_4_ =
             subelems_allocator((lysp_yin_ctx *)node_meta_local,0x11,parent,
                                (yin_subelement **)&choice,0x20,parent + 1,CONCAT44(uVar2,8),0x40,
                                parent + 1,0,0x100,parent + 1,0,0x200,parent + 1,8,0x50000,
                                &parent->flags,2,0x400,parent + 1,0,0x70000,&parent[1].next,2,
                                0x80000,&parent->dsc,2,0x130000,&parent->iffeatures,0,0x1000,
                                parent + 1,0,0x2000,parent + 1,0,0x4000,parent + 1,0,0x180000,
                                &parent->flags,2,0x270000,&parent->ref,2,0x2c0000,&parent->flags,2,
                                0x330000,&parent[1].nodetype,2,0xf0000,0,0),
       ctx_local._4_4_ == LY_SUCCESS)) {
      subelems._4_4_ =
           yin_parse_content((lysp_yin_ctx *)node_meta_local,(yin_subelement *)choice,0x11,parent,
                             LY_STMT_CHOICE,(char **)0x0,&parent->exts);
      subelems_deallocator(0x11,(yin_subelement *)choice);
      if (subelems._4_4_ == LY_SUCCESS) {
        ctx_local._4_4_ = yin_unres_exts_add((lysp_yin_ctx *)node_meta_local,parent->exts);
        if (ctx_local._4_4_ == LY_SUCCESS) {
          ctx_local._4_4_ = subelems._4_4_;
        }
      }
      else {
        ctx_local._4_4_ = subelems._4_4_;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

LY_ERR
yin_parse_choice(struct lysp_yin_ctx *ctx, struct tree_node_meta *node_meta)
{
    LY_ERR ret = LY_SUCCESS;
    struct yin_subelement *subelems = NULL;
    struct lysp_node_choice *choice;
    size_t subelems_size;

    /* create new choice */
    LY_LIST_NEW_RET(ctx->xmlctx->ctx, node_meta->nodes, choice, next, LY_EMEM);

    choice->nodetype = LYS_CHOICE;
    choice->parent = node_meta->parent;

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &choice->name, Y_IDENTIF_ARG, LY_STMT_CHOICE));

    /* parse choice content */
    LY_CHECK_RET(subelems_allocator(ctx, subelems_size = 17, (struct lysp_node *)choice, &subelems,
            LY_STMT_ANYDATA, &choice->child, YIN_SUBELEM_VER2,
            LY_STMT_ANYXML, &choice->child, 0,
            LY_STMT_CASE, &choice->child, 0,
            LY_STMT_CHOICE, &choice->child, YIN_SUBELEM_VER2,
            LY_STMT_CONFIG, &choice->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_CONTAINER, &choice->child, 0,
            LY_STMT_DEFAULT, &choice->dflt, YIN_SUBELEM_UNIQUE,
            LY_STMT_DESCRIPTION, &choice->dsc, YIN_SUBELEM_UNIQUE,
            LY_STMT_IF_FEATURE, &choice->iffeatures, 0,
            LY_STMT_LEAF, &choice->child, 0,
            LY_STMT_LEAF_LIST, &choice->child, 0,
            LY_STMT_LIST, &choice->child, 0,
            LY_STMT_MANDATORY, &choice->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_REFERENCE, &choice->ref, YIN_SUBELEM_UNIQUE,
            LY_STMT_STATUS, &choice->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_WHEN, &choice->when, YIN_SUBELEM_UNIQUE,
            LY_STMT_EXTENSION_INSTANCE, NULL, 0));
    ret = yin_parse_content(ctx, subelems, subelems_size, choice, LY_STMT_CHOICE, NULL, &choice->exts);
    subelems_deallocator(subelems_size, subelems);
    LY_CHECK_RET(ret);

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, choice->exts));

    return ret;
}